

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

void __thiscall Deck::~Deck(Deck *this)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  Deck *this_local;
  
  if (this->deckSize != (int *)0x0) {
    operator_delete(this->deckSize,4);
  }
  pvVar1 = this->deckPointer;
  if (pvVar1 != (vector<CardType,_std::allocator<CardType>_> *)0x0) {
    std::vector<CardType,_std::allocator<CardType>_>::~vector(pvVar1);
    operator_delete(pvVar1,0x18);
  }
  pvVar1 = this->discardPointer;
  if (pvVar1 != (vector<CardType,_std::allocator<CardType>_> *)0x0) {
    std::vector<CardType,_std::allocator<CardType>_>::~vector(pvVar1);
    operator_delete(pvVar1,0x18);
  }
  return;
}

Assistant:

Deck::~Deck() {
    delete deckSize;
    delete deckPointer;
    delete discardPointer;
}